

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgpaintelement.cpp
# Opt level: O2

void __thiscall
lunasvg::SVGRadialGradientElement::SVGRadialGradientElement
          (SVGRadialGradientElement *this,Document *document)

{
  SVGGradientElement::SVGGradientElement(&this->super_SVGGradientElement,document,RadialGradient);
  (this->super_SVGGradientElement).super_SVGPaintElement.super_SVGElement.super_SVGNode.
  _vptr_SVGNode = (_func_int **)&PTR__SVGRadialGradientElement_00155200;
  SVGLength::SVGLength(&this->m_cx,Cx,Horizontal,Allow,50.0,Percent);
  SVGLength::SVGLength(&this->m_cy,Cy,Vertical,Allow,50.0,Percent);
  SVGLength::SVGLength(&this->m_r,R,Diagonal,Forbid,50.0,Percent);
  SVGLength::SVGLength(&this->m_fx,Fx,Horizontal,Allow,0.0,None);
  SVGLength::SVGLength(&this->m_fy,Fy,Vertical,Allow,0.0,None);
  SVGElement::addProperty((SVGElement *)this,&(this->m_cx).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_cy).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_r).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_fx).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_fy).super_SVGProperty);
  return;
}

Assistant:

SVGRadialGradientElement::SVGRadialGradientElement(Document* document)
    : SVGGradientElement(document, ElementID::RadialGradient)
    , m_cx(PropertyID::Cx, LengthDirection::Horizontal, LengthNegativeMode::Allow, 50.f, LengthUnits::Percent)
    , m_cy(PropertyID::Cy, LengthDirection::Vertical, LengthNegativeMode::Allow, 50.f, LengthUnits::Percent)
    , m_r(PropertyID::R, LengthDirection::Diagonal, LengthNegativeMode::Forbid, 50.f, LengthUnits::Percent)
    , m_fx(PropertyID::Fx, LengthDirection::Horizontal, LengthNegativeMode::Allow, 0.f, LengthUnits::None)
    , m_fy(PropertyID::Fy, LengthDirection::Vertical, LengthNegativeMode::Allow, 0.f, LengthUnits::None)
{
    addProperty(m_cx);
    addProperty(m_cy);
    addProperty(m_r);
    addProperty(m_fx);
    addProperty(m_fy);
}